

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall Spaghetti<UFPC>::FirstScan(Spaghetti<UFPC> *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uint *puVar10;
  int iVar11;
  int local_b4;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_1;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int w;
  int h;
  Spaghetti<UFPC> *this_local;
  
  uVar7 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar1 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar7 & 0xfffffffe;
  this->o_rows = (int)uVar7 % 2 == 1;
  this->e_cols = uVar1 & 0xfffffffe;
  this->o_cols = (int)uVar1 % 2 == 1;
  UFPC::Setup();
  if (uVar7 == 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,0);
    img_row_1._4_4_ = -2;
LAB_00174ba4:
    iVar6 = img_row_1._4_4_ + 2;
    if (iVar6 < (int)(uVar1 - 2)) {
      if (puVar9[iVar6] == '\0') goto LAB_00174c1f;
      if (puVar9[img_row_1._4_4_ + 3] == '\0') {
        uVar7 = UFPC::NewLabel();
        puVar10[iVar6] = uVar7;
        img_row_1._4_4_ = iVar6;
      }
      else {
        uVar7 = UFPC::NewLabel();
        puVar10[iVar6] = uVar7;
        img_row_1._4_4_ = iVar6;
        while( true ) {
          while( true ) {
            iVar6 = img_row_1._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar6) {
              if ((int)(uVar1 - 2) < iVar6) {
                if (puVar9[iVar6] != '\0') {
                  puVar10[iVar6] = puVar10[img_row_1._4_4_];
                  return;
                }
                puVar10[iVar6] = 0;
                return;
              }
              if (puVar9[iVar6] != '\0') {
                if (puVar9[img_row_1._4_4_ + 3] != '\0') {
                  puVar10[iVar6] = puVar10[img_row_1._4_4_];
                  return;
                }
                puVar10[iVar6] = puVar10[img_row_1._4_4_];
                return;
              }
              goto LAB_00174dbc;
            }
            if (puVar9[iVar6] == '\0') break;
            if (puVar9[img_row_1._4_4_ + 3] == '\0') {
              puVar10[iVar6] = puVar10[img_row_1._4_4_];
              img_row_1._4_4_ = iVar6;
              goto LAB_00174ba4;
            }
            puVar10[iVar6] = puVar10[img_row_1._4_4_];
            img_row_1._4_4_ = iVar6;
          }
LAB_00174c1f:
          img_row_1._4_4_ = iVar6;
          if (puVar9[img_row_1._4_4_ + 1] == '\0') break;
          uVar7 = UFPC::NewLabel();
          puVar10[img_row_1._4_4_] = uVar7;
        }
        puVar10[img_row_1._4_4_] = 0;
      }
      goto LAB_00174ba4;
    }
    if ((int)(uVar1 - 2) < iVar6) {
      if (puVar9[iVar6] == '\0') {
        puVar10[iVar6] = 0;
      }
      else {
        uVar7 = UFPC::NewLabel();
        puVar10[iVar6] = uVar7;
      }
    }
    else if (puVar9[iVar6] == '\0') {
LAB_00174dbc:
      img_row_1._4_4_ = iVar6;
      if (puVar9[img_row_1._4_4_ + 1] == '\0') {
        puVar10[img_row_1._4_4_] = 0;
      }
      else {
        uVar7 = UFPC::NewLabel();
        puVar10[img_row_1._4_4_] = uVar7;
      }
    }
    else if (puVar9[img_row_1._4_4_ + 3] == '\0') {
      uVar7 = UFPC::NewLabel();
      puVar10[iVar6] = uVar7;
    }
    else {
      uVar7 = UFPC::NewLabel();
      puVar10[iVar6] = uVar7;
    }
  }
  else {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,0);
    img_row_2._4_4_ = -2;
LAB_00174eaf:
    img_row_2._4_4_ = img_row_2._4_4_ + 2;
    iVar6 = img_row_2._4_4_;
    if (img_row_2._4_4_ < (int)(uVar1 - 2)) {
      if ((puVar9[img_row_2._4_4_] == '\0') && (puVar9[img_row_2._4_4_ + lVar2] == '\0'))
      goto LAB_00174f45;
LAB_00174eec:
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        uVar8 = UFPC::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
        goto LAB_00175052;
      }
      uVar8 = UFPC::NewLabel();
      puVar10[img_row_2._4_4_] = uVar8;
LAB_00174fad:
      do {
        iVar6 = img_row_2._4_4_ + 2;
        if ((int)(uVar1 - 2) <= iVar6) {
          if ((int)(uVar1 - 2) < iVar6) {
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar2] == '\0') {
                puVar10[iVar6] = 0;
              }
              else {
                puVar10[iVar6] = puVar10[img_row_2._4_4_];
              }
            }
            else {
              puVar10[iVar6] = puVar10[img_row_2._4_4_];
            }
          }
          else {
            img_row_2._4_4_ = iVar6;
            if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) goto LAB_00175332;
LAB_001753b3:
            if (puVar9[img_row_2._4_4_ + 1] == '\0') {
              puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
            }
            else {
              puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
            }
          }
          goto LAB_00175484;
        }
        img_row_2._4_4_ = iVar6;
        if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) {
LAB_00174f45:
          img_row_2._4_4_ = iVar6;
          if (puVar9[img_row_2._4_4_ + 1] == '\0') {
            if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
              puVar10[img_row_2._4_4_] = 0;
              goto LAB_00174eaf;
            }
            uVar8 = UFPC::NewLabel();
            puVar10[img_row_2._4_4_] = uVar8;
          }
          else {
            uVar8 = UFPC::NewLabel();
            puVar10[img_row_2._4_4_] = uVar8;
          }
        }
        else {
          while (puVar9[img_row_2._4_4_ + 1] == '\0') {
            puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
LAB_00175052:
            while( true ) {
              iVar6 = img_row_2._4_4_ + 2;
              if ((int)(uVar1 - 2) <= iVar6) {
                if ((int)(uVar1 - 2) < iVar6) {
                  if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) {
                    puVar10[iVar6] = 0;
                    goto LAB_00175484;
                  }
                }
                else {
                  if (puVar9[iVar6] != '\0') {
                    iVar11 = img_row_2._4_4_ + 1;
                    img_row_2._4_4_ = iVar6;
                    if (puVar9[iVar11 + lVar2] == '\0') goto LAB_001752df;
                    goto LAB_001753b3;
                  }
                  if (puVar9[iVar6 + lVar2] == '\0') goto LAB_00175332;
                }
                if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                  uVar8 = UFPC::NewLabel();
                  puVar10[iVar6] = uVar8;
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_2._4_4_];
                }
                goto LAB_00175484;
              }
              if (puVar9[iVar6] != '\0') break;
              if (puVar9[iVar6 + lVar2] == '\0') goto LAB_00174f45;
              if (puVar9[img_row_2._4_4_ + 3] != '\0') {
                if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                  uVar8 = UFPC::NewLabel();
                  puVar10[iVar6] = uVar8;
                  img_row_2._4_4_ = iVar6;
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar6;
                }
                goto LAB_00174fad;
              }
              if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                uVar8 = UFPC::NewLabel();
                puVar10[iVar6] = uVar8;
                img_row_2._4_4_ = iVar6;
              }
              else {
                puVar10[iVar6] = puVar10[img_row_2._4_4_];
                img_row_2._4_4_ = iVar6;
              }
            }
            iVar11 = img_row_2._4_4_ + 1;
            img_row_2._4_4_ = iVar6;
            if (puVar9[iVar11 + lVar2] == '\0') goto LAB_00174eec;
          }
          puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
        }
      } while( true );
    }
    if ((int)(uVar1 - 2) < img_row_2._4_4_) {
      if (puVar9[img_row_2._4_4_] == '\0') {
        if (puVar9[img_row_2._4_4_ + lVar2] == '\0') {
          puVar10[img_row_2._4_4_] = 0;
        }
        else {
          uVar8 = UFPC::NewLabel();
          puVar10[img_row_2._4_4_] = uVar8;
        }
      }
      else {
        uVar8 = UFPC::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
    else if ((puVar9[img_row_2._4_4_] == '\0') && (puVar9[img_row_2._4_4_ + lVar2] == '\0')) {
LAB_00175332:
      img_row_2._4_4_ = iVar6;
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
          puVar10[img_row_2._4_4_] = 0;
        }
        else {
          uVar8 = UFPC::NewLabel();
          puVar10[img_row_2._4_4_] = uVar8;
        }
      }
      else {
        uVar8 = UFPC::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
    else {
LAB_001752df:
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        uVar8 = UFPC::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
      else {
        uVar8 = UFPC::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
LAB_00175484:
    for (img_row_2._0_4_ = 2;
        (int)img_row_2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
        img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar9 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar2;
      lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar10 = cv::Mat::ptr<unsigned_int>
                          (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            super_Mat,(int)img_row_2);
      lVar5 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      iVar6 = 0;
      img_row_3._4_4_ = 0;
      if (0 < (int)(uVar1 - 2)) {
        if (*puVar9 == '\0') goto LAB_00175713;
LAB_00175589:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001755d6;
          if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
            uVar8 = UFPC::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
            goto LAB_001771a6;
          }
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
          goto LAB_0017726d;
        }
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
LAB_0017769e:
        do {
          iVar6 = img_row_3._4_4_ + 2;
          if ((int)(uVar1 - 2) <= iVar6) {
            if ((int)(uVar1 - 2) < iVar6) {
              if (puVar9[iVar6] == '\0') {
                if (puVar9[iVar6 + lVar3] == '\0') {
                  puVar10[iVar6] = 0;
                }
                else {
LAB_0017824d:
                  if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                    if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                      uVar8 = UFPC::NewLabel();
                      puVar10[iVar6] = uVar8;
                    }
                    else {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    }
                  }
                  else {
                    puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  }
                }
              }
              else if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
LAB_001781ed:
                  if (puVar9[iVar6 - lVar2] == '\0') {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                  else {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                  }
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                }
              }
              else {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
              }
              goto LAB_00179028;
            }
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178423;
              if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_0017824d;
              if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00178a6d;
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001783aa;
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                if (puVar9[iVar6 - lVar2] == '\0') {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                }
                goto LAB_00179028;
              }
            }
            else {
              if ((puVar9[img_row_3._4_4_ + 1] == '\0') &&
                 (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0')) {
                if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') goto LAB_001781ed;
                img_row_3._4_4_ = iVar6;
                if (puVar9[iVar6 - lVar2] == '\0') {
LAB_001784f9:
                  if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                 (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                        *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5)
                                       );
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                }
                goto LAB_00179028;
              }
LAB_00178a6d:
              img_row_3._4_4_ = iVar6;
              iVar6 = img_row_3._4_4_;
              if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                goto LAB_00179028;
              }
            }
LAB_00178a89:
            img_row_3._4_4_ = iVar6;
            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
              if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                    puVar10[img_row_3._4_4_ + -2]);
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
            }
            else {
              puVar10[img_row_3._4_4_] =
                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            }
            goto LAB_00179028;
          }
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_0017578b;
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] != '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_00176d5d;
              }
              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                uVar8 = UFPC::NewLabel();
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_00176d5d;
              }
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
              goto LAB_00176d5d;
            }
            if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00176c90;
            if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_0017573c;
            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_00176cac;
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') goto LAB_00176b33;
            if (puVar9[iVar6 - lVar2] != '\0') {
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_0017642f;
            }
            puVar10[iVar6] = puVar10[img_row_3._4_4_];
            img_row_3._4_4_ = iVar6;
LAB_001761d0:
            iVar6 = img_row_3._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar6) {
              if ((int)(uVar1 - 2) < iVar6) {
LAB_00177f93:
                img_row_3._4_4_ = iVar6;
                if (puVar9[img_row_3._4_4_] == '\0') {
LAB_00177f4f:
                  if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
                    puVar10[img_row_3._4_4_] = 0;
                  }
                  else {
                    puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                  }
                }
                else {
                  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                }
                goto LAB_00179028;
              }
              if (puVar9[iVar6] == '\0') {
                if (puVar9[iVar6 + lVar3] == '\0') {
LAB_00178830:
                  img_row_3._4_4_ = iVar6;
                  if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_00178440;
                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                    uVar8 = UFPC::NewLabel();
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                  goto LAB_00179028;
                }
                if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  goto LAB_00179028;
                }
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
              }
              else {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                    puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
              }
              goto LAB_00179028;
            }
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar3] == '\0') {
LAB_00176396:
                img_row_3._4_4_ = iVar6;
                iVar6 = img_row_3._4_4_;
                if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_001757a5;
                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  goto LAB_00176a14;
                }
                if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
LAB_001767c9:
                  iVar6 = img_row_3._4_4_ + 2;
                  if ((int)(uVar1 - 2) <= iVar6) {
                    if ((int)(uVar1 - 2) < iVar6) goto LAB_00177f93;
                    if (puVar9[iVar6] == '\0') {
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        iVar11 = img_row_3._4_4_ + 3;
                        img_row_3._4_4_ = iVar6;
                        if (puVar9[iVar11] == '\0') goto LAB_00178440;
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        goto LAB_00179028;
                      }
                      if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                        puVar10[iVar6] = puVar10[img_row_3._4_4_];
                        goto LAB_00179028;
                      }
                    }
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    }
                    else {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                    }
                    goto LAB_00179028;
                  }
                  if (puVar9[iVar6] == '\0') {
                    if (puVar9[iVar6 + lVar3] == '\0') {
                      if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001757a5;
                      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        img_row_3._4_4_ = iVar6;
                        goto LAB_00176a14;
                      }
                      iVar11 = img_row_3._4_4_ + 4;
                      img_row_3._4_4_ = iVar6;
                      if (puVar9[iVar11 - lVar2] == '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        goto LAB_0017642f;
                      }
LAB_00175603:
                      if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                     (long)img_row_3._4_4_ * 4 + lVar5),
                                            *(uint *)((long)puVar10 +
                                                     (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                        puVar10[img_row_3._4_4_] = uVar8;
                      }
                      else {
                        puVar10[img_row_3._4_4_] =
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                      }
                      goto LAB_001767c9;
                    }
                    if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                      goto LAB_00176d5d;
                    }
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                      img_row_3._4_4_ = iVar6;
                      goto LAB_00176a14;
                    }
                  }
                  else {
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                      img_row_3._4_4_ = iVar6;
                      goto LAB_0017769e;
                    }
                    if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                      goto LAB_001779ac;
                    }
                  }
                  if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
                    puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar6;
LAB_00176e59:
                    do {
                      iVar6 = img_row_3._4_4_ + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) goto LAB_00177f93;
                        if (puVar9[iVar6] == '\0') {
                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178830;
                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                            goto LAB_00179028;
                          }
                        }
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                        }
                        else if (puVar9[iVar6 + lVar4] == '\0') {
                          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                              puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                        }
                        else {
LAB_0017831f:
                          img_row_3._4_4_ = iVar6;
                          iVar6 = img_row_3._4_4_;
                          if (puVar9[(img_row_3._4_4_ + -2) - lVar2] == '\0') {
                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                         (long)img_row_3._4_4_ * 4 + lVar5),
                                                puVar10[img_row_3._4_4_ + -2]);
                            puVar10[img_row_3._4_4_] = uVar8;
                          }
                          else {
LAB_001780e5:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                           (long)img_row_3._4_4_ * 4 + lVar5),
                                                  puVar10[img_row_3._4_4_ + -2]);
                              puVar10[img_row_3._4_4_] = uVar8;
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          }
                        }
                        goto LAB_00179028;
                      }
                      if (puVar9[iVar6] == '\0') {
                        if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00176396;
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar6;
                          goto LAB_00176d5d;
                        }
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                          if (puVar9[iVar6 + lVar4] == '\0') {
                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else {
                            if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_0017670a;
                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
LAB_00176a14:
                          do {
                            iVar6 = img_row_3._4_4_ + 2;
                            if ((int)(uVar1 - 2) <= iVar6) {
                              if ((int)(uVar1 - 2) < iVar6) goto LAB_00177f93;
                              if (puVar9[iVar6] != '\0') goto LAB_00178a6d;
                              if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178423;
                              if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_00178a6d;
                              puVar10[iVar6] = puVar10[img_row_3._4_4_];
                              goto LAB_00179028;
                            }
                            if (puVar9[iVar6] != '\0') goto LAB_00176a55;
                            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_0017578b;
                            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                              puVar10[iVar6] = puVar10[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar6;
LAB_00176d5d:
                              iVar6 = img_row_3._4_4_ + 2;
                              if (iVar6 < (int)(uVar1 - 2)) {
                                if (puVar9[iVar6] != '\0') {
                                  iVar11 = img_row_3._4_4_ + 1;
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[iVar11 + lVar3] == '\0') goto LAB_00175822;
                                  goto LAB_00175b6c;
                                }
LAB_00176dba:
                                img_row_3._4_4_ = iVar6;
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[img_row_3._4_4_ + lVar3] == '\0') goto LAB_0017578b;
                                if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                  if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0')
                                  goto LAB_0017573c;
LAB_00176064:
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
LAB_001760ae:
                                    if (puVar9[(img_row_3._4_4_ + 2) - lVar2] == '\0') {
LAB_00175f1e:
                                      if (puVar9[img_row_3._4_4_ - lVar2] != '\0') {
                                        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                     (long)img_row_3._4_4_ * 4 +
                                                                     lVar5),
                                                            puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
LAB_0017642f:
                                        iVar6 = img_row_3._4_4_ + 2;
                                        if (iVar6 < (int)(uVar1 - 2)) {
                                          if (puVar9[iVar6] != '\0') {
                                            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                            goto LAB_00176530;
                                            if (puVar9[iVar6 + lVar4] != '\0') goto LAB_0017649b;
                                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                         (long)iVar6 * 4 + lVar5),
                                                                puVar10[img_row_3._4_4_]);
                                            puVar10[iVar6] = uVar8;
                                            img_row_3._4_4_ = iVar6;
                                            goto LAB_0017769e;
                                          }
                                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00176396;
                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar6;
                                            goto LAB_00176d5d;
                                          }
                                          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                          goto LAB_0017654c;
                                          if (puVar9[iVar6 + lVar4] == '\0') {
                                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                         (long)iVar6 * 4 + lVar5),
                                                                puVar10[img_row_3._4_4_]);
                                            puVar10[iVar6] = uVar8;
                                            img_row_3._4_4_ = iVar6;
                                          }
                                          else {
LAB_0017670a:
                                            img_row_3._4_4_ = iVar6;
                                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                                              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                           (long)img_row_3._4_4_ * 4
                                                                           + lVar5),
                                                                  puVar10[img_row_3._4_4_ + -2]);
                                              puVar10[img_row_3._4_4_] = uVar8;
                                            }
                                            else {
                                              puVar10[img_row_3._4_4_] =
                                                   *(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5);
                                            }
                                          }
                                          goto LAB_00176a14;
                                        }
                                        if ((int)(uVar1 - 2) < iVar6) goto LAB_00177f93;
                                        if (puVar9[iVar6] == '\0') {
                                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178830;
                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                            goto LAB_00179028;
                                          }
                                        }
                                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                        }
                                        else {
                                          if (puVar9[iVar6 + lVar4] != '\0') goto LAB_001780e5;
                                          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                       (long)iVar6 * 4 + lVar5),
                                                              puVar10[img_row_3._4_4_]);
                                          puVar10[iVar6] = uVar8;
                                        }
                                        goto LAB_00179028;
                                      }
                                      puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                      goto LAB_001761d0;
                                    }
                                    if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                                      if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                     (long)(img_row_3._4_4_ + 2) * 4
                                                                     + lVar5),
                                                            puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
                                      }
                                      else {
                                        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                     (long)img_row_3._4_4_ * 4 +
                                                                     lVar5),
                                                            *(uint *)((long)puVar10 +
                                                                     (long)(img_row_3._4_4_ + 2) * 4
                                                                     + lVar5));
                                        uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
                                      }
                                    }
                                    else {
                                      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                   (long)(img_row_3._4_4_ + 2) * 4 +
                                                                   lVar5),
                                                          puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    goto LAB_001767c9;
                                  }
                                  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                               (long)img_row_3._4_4_ * 4 + lVar5),
                                                      puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_00176a14;
                                }
LAB_00176e07:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                  uVar8 = UFPC::NewLabel();
                                  puVar10[img_row_3._4_4_] = uVar8;
                                }
                                else {
                                  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                }
                                goto LAB_00176d5d;
                              }
                              if ((int)(uVar1 - 2) < iVar6) {
                                if (puVar9[iVar6] == '\0') {
LAB_00177ffb:
                                  img_row_3._4_4_ = iVar6;
                                  iVar6 = img_row_3._4_4_;
                                  if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
                                    puVar10[img_row_3._4_4_] = 0;
                                  }
                                  else {
LAB_0017800e:
                                    img_row_3._4_4_ = iVar6;
                                    if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                      uVar8 = UFPC::NewLabel();
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                    }
                                  }
                                }
                                else {
                                  iVar11 = img_row_3._4_4_ + 1;
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[iVar11 + lVar3] != '\0') goto LAB_00177ea2;
LAB_00177e0f:
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                                      uVar8 = UFPC::NewLabel();
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      puVar10[img_row_3._4_4_] =
                                           *(uint *)((long)puVar10 +
                                                    (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
                                    }
                                  }
                                  else {
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                }
                                goto LAB_00179028;
                              }
                              if (puVar9[iVar6] == '\0') {
LAB_00178bb1:
                                img_row_3._4_4_ = iVar6;
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[img_row_3._4_4_ + lVar3] == '\0') goto LAB_00178423;
                                if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_0017800e;
LAB_00178bda:
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0')
                                goto LAB_001783aa;
LAB_001786f8:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                                  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                               (long)img_row_3._4_4_ * 4 + lVar5),
                                                      puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_00179028;
                                }
                              }
                              else {
                                iVar11 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[iVar11 + lVar3] == '\0') {
LAB_0017849b:
                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0')
                                  goto LAB_00177e0f;
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0')
                                    goto LAB_001784f9;
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                  else {
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                  goto LAB_00179028;
                                }
LAB_00178593:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                                      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar5
                                                                   ),puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                                      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                   (long)(img_row_3._4_4_ + -2) * 4
                                                                   + lVar5),
                                                          *(uint *)((long)puVar10 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar5
                                                                   ));
                                      uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar5
                                                                   ),puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                  }
                                  else {
                                    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                                 (long)img_row_3._4_4_ * 4 + lVar5),
                                                        puVar10[img_row_3._4_4_ + -2]);
                                    puVar10[img_row_3._4_4_] = uVar8;
                                  }
                                  goto LAB_00179028;
                                }
LAB_00177ea2:
                                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0') {
                                  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                               (long)(img_row_3._4_4_ + -2) * 4 +
                                                               lVar5),puVar10[img_row_3._4_4_ + -2])
                                  ;
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_00179028;
                                }
                              }
LAB_00177eee:
                              if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                              }
                              else {
                                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                             (long)img_row_3._4_4_ * 4 + lVar5),
                                                    puVar10[img_row_3._4_4_ + -2]);
                                puVar10[img_row_3._4_4_] = uVar8;
                              }
                              goto LAB_00179028;
                            }
LAB_00176c90:
                            img_row_3._4_4_ = iVar6;
                            iVar6 = img_row_3._4_4_;
                            if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') goto LAB_00176b17;
LAB_00176cac:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                              if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                             (long)img_row_3._4_4_ * 4 + lVar5),
                                                    puVar10[img_row_3._4_4_ + -2]);
                                puVar10[img_row_3._4_4_] = uVar8;
                              }
                              else {
                                puVar10[img_row_3._4_4_] =
                                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                              }
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          } while( true );
                        }
                      }
                      else {
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                          if (puVar9[iVar6 + lVar4] == '\0') {
                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else {
LAB_0017649b:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                           (long)img_row_3._4_4_ * 4 + lVar5),
                                                  puVar10[img_row_3._4_4_ + -2]);
                              puVar10[img_row_3._4_4_] = uVar8;
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          }
                          goto LAB_0017769e;
                        }
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar6;
                          goto LAB_001779ac;
                        }
                      }
                      if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') {
                        if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
                          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                              puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else if (puVar9[iVar6 + lVar4] == '\0') {
                          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                              puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                              puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else {
LAB_00176593:
                          img_row_3._4_4_ = iVar6;
                          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                         (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                                                puVar10[img_row_3._4_4_ + -2]);
                            puVar10[img_row_3._4_4_] = uVar8;
                          }
                          else {
                            puVar10[img_row_3._4_4_] =
                                 *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                          }
                        }
                        goto LAB_001767c9;
                      }
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                    } while( true );
                  }
                  if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
                    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                 (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                        puVar10[img_row_3._4_4_]);
                    puVar10[iVar6] = uVar8;
                    img_row_3._4_4_ = iVar6;
                  }
                  else {
                    puVar10[iVar6] =
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5);
                    img_row_3._4_4_ = iVar6;
                  }
                  goto LAB_001767c9;
                }
                uVar8 = UFPC::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                goto LAB_001761d0;
              }
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_00176d5d;
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                    puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_00176a14;
              }
            }
            else {
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                    puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_0017769e;
              }
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_001779ac;
              }
            }
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
              goto LAB_00176e59;
            }
            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                puVar10[img_row_3._4_4_]);
            puVar10[iVar6] = uVar8;
            img_row_3._4_4_ = iVar6;
            goto LAB_001767c9;
          }
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00176a55;
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] != '\0') goto LAB_00176a55;
          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[iVar6 - lVar2] == '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                img_row_3._4_4_ = iVar6;
                goto LAB_001771a6;
              }
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_0017726d;
            }
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') {
              img_row_3._4_4_ = iVar6;
              if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00175603;
              goto LAB_0017595f;
            }
            if (puVar9[iVar6 - lVar2] != '\0') {
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_0017642f;
            }
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            img_row_3._4_4_ = iVar6;
            goto LAB_001761d0;
          }
          img_row_3._4_4_ = iVar6;
          if (puVar9[iVar6 - lVar2] == '\0') {
LAB_00175880:
            if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5
                                           ),
                                  *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5));
              puVar10[img_row_3._4_4_] = uVar8;
            }
            else {
              puVar10[img_row_3._4_4_] =
                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            }
          }
          else {
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
          }
        } while( true );
      }
      img_row_3._4_4_ = iVar6;
      if ((int)(uVar1 - 2) < 0) {
        if (*puVar9 == '\0') {
LAB_00177dc1:
          if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
            puVar10[img_row_3._4_4_] = 0;
          }
          else {
            uVar8 = UFPC::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
          }
          goto LAB_00179028;
        }
LAB_00177d82:
        img_row_3._4_4_ = iVar6;
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = UFPC::NewLabel();
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
        }
      }
      else if (*puVar9 == '\0') {
LAB_001783e4:
        iVar6 = img_row_3._4_4_;
        if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
LAB_00178423:
          img_row_3._4_4_ = iVar6;
          iVar6 = img_row_3._4_4_;
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001783aa;
LAB_00178440:
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
            puVar10[img_row_3._4_4_] = 0;
          }
          else {
            uVar8 = UFPC::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
          }
        }
        else {
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001783aa;
          uVar8 = UFPC::NewLabel();
          puVar10[img_row_3._4_4_] = uVar8;
        }
      }
      else {
LAB_001783aa:
        img_row_3._4_4_ = iVar6;
        iVar6 = img_row_3._4_4_;
        if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') goto LAB_00177d82;
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
      }
LAB_00179028:
    }
    if ((this->o_rows & 1U) != 0) {
      puVar9 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          uVar7 - 1);
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar2;
      puVar10 = cv::Mat::ptr<unsigned_int>
                          (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            super_Mat,uVar7 - 1);
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      local_b4 = -2;
LAB_00179102:
      iVar6 = local_b4 + 2;
      if (iVar6 < (int)(uVar1 - 2)) {
        if (puVar9[iVar6] == '\0') goto LAB_00179362;
        if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
          local_b4 = iVar6;
          goto LAB_0017a37c;
        }
        iVar11 = local_b4 + 3;
        local_b4 = iVar6;
        if (puVar9[iVar11] == '\0') {
          if (puVar9[iVar6 - lVar2] == '\0') {
            uVar7 = UFPC::NewLabel();
            puVar10[iVar6] = uVar7;
          }
          else {
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
          }
        }
        else {
LAB_001791b5:
          if (puVar9[(local_b4 + 2) - lVar2] != '\0') {
            iVar6 = local_b4;
            if (puVar9[local_b4 - lVar2] != '\0') goto LAB_001791f2;
            puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
            goto LAB_00179dfb;
          }
          if (puVar9[local_b4 - lVar2] == '\0') {
            uVar7 = UFPC::NewLabel();
            puVar10[local_b4] = uVar7;
            goto LAB_0017983c;
          }
          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
LAB_00179aab:
          iVar6 = local_b4 + 2;
          if ((int)(uVar1 - 2) <= iVar6) {
            if (iVar6 <= (int)(uVar1 - 2)) {
              if (puVar9[iVar6] == '\0') {
LAB_0017ada1:
                local_b4 = iVar6;
                if (puVar9[local_b4 + 1] == '\0') {
                  puVar10[local_b4] = 0;
                  return;
                }
                if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                  puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                  return;
                }
                uVar7 = UFPC::NewLabel();
                puVar10[local_b4] = uVar7;
                return;
              }
              if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                puVar10[iVar6] = puVar10[local_b4];
                return;
              }
              if (puVar9[iVar6 + lVar3] == '\0') {
                uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                    puVar10[local_b4]);
                puVar10[iVar6] = uVar7;
                return;
              }
LAB_0017ae8b:
              local_b4 = iVar6;
              if (puVar9[(local_b4 + -1) + lVar3] != '\0') {
                puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                return;
              }
              uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + -2) * 4 + lVar4),
                                  *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4));
              puVar10[local_b4] = uVar7;
              return;
            }
LAB_0017a9d9:
            local_b4 = iVar6;
            if (puVar9[local_b4] != '\0') {
              puVar10[local_b4] = puVar10[local_b4 + -2];
              return;
            }
            puVar10[local_b4] = 0;
            return;
          }
          if (puVar9[iVar6] == '\0') goto LAB_001799c9;
          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
            if (puVar9[iVar6 + lVar3] != '\0') goto LAB_00179b36;
            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),puVar10[local_b4]
                               );
            puVar10[iVar6] = uVar7;
            local_b4 = iVar6;
            goto LAB_0017a37c;
          }
          if (puVar9[local_b4 + 3] != '\0') {
            if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[local_b4];
              local_b4 = iVar6;
              goto LAB_0017a580;
            }
            if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
              uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                  puVar10[local_b4]);
              puVar10[iVar6] = uVar7;
              local_b4 = iVar6;
              goto LAB_00179dfb;
            }
            if (puVar9[iVar6 + lVar3] == '\0') {
              uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                  puVar10[local_b4]);
              puVar10[iVar6] = uVar7;
              local_b4 = iVar6;
              goto LAB_00179dfb;
            }
LAB_00179c7e:
            local_b4 = iVar6;
            if (puVar9[(local_b4 + -1) + lVar3] == '\0') {
              uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4),
                                  puVar10[local_b4 + -2]);
              puVar10[local_b4] = uVar7;
            }
            else {
              puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
            }
LAB_00179dfb:
            do {
              iVar6 = local_b4 + 2;
              if ((int)(uVar1 - 2) <= iVar6) {
                if (iVar6 <= (int)(uVar1 - 2)) {
                  if (puVar9[iVar6] == '\0') {
                    if (puVar9[local_b4 + 3] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                      return;
                    }
                    puVar10[iVar6] = 0;
                    return;
                  }
                  if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                    return;
                  }
                  puVar10[iVar6] = puVar10[local_b4];
                  return;
                }
                goto LAB_0017a9d9;
              }
              if (puVar9[iVar6] != '\0') {
                if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                  local_b4 = iVar6;
                  goto LAB_0017a37c;
                }
                if (puVar9[local_b4 + 3] == '\0') {
                  puVar10[iVar6] = puVar10[local_b4];
                  local_b4 = iVar6;
                  goto LAB_00179102;
                }
                if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                  puVar10[iVar6] = puVar10[local_b4];
                  local_b4 = iVar6;
LAB_0017a580:
                  do {
                    iVar6 = local_b4 + 2;
                    if ((int)(uVar1 - 2) <= iVar6) {
                      if ((int)(uVar1 - 2) < iVar6) goto LAB_0017a9d9;
                      if (puVar9[iVar6] == '\0') goto LAB_0017ada1;
                      if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        return;
                      }
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                            puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        return;
                      }
                      if (puVar9[local_b4 - lVar2] == '\0') {
                        uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                            puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        return;
                      }
                      goto LAB_0017ae8b;
                    }
                    if (puVar9[iVar6] == '\0') goto LAB_001799c9;
                    if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                      if (puVar9[local_b4 + 3] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        local_b4 = iVar6;
                        goto LAB_00179102;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
                          uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(local_b4 + 4) * 4 + lVar4),
                                              puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                          goto LAB_00179dfb;
                        }
                        if (puVar9[iVar6 + lVar3] == '\0') {
                          uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(local_b4 + 4) * 4 + lVar4),
                                              puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                        }
                        else {
                          if (puVar9[local_b4 - lVar2] != '\0') goto LAB_00179c7e;
                          uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(local_b4 + 4) * 4 + lVar4),
                                              puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                        }
                        goto LAB_00179dfb;
                      }
                      puVar10[iVar6] = puVar10[local_b4];
                      local_b4 = iVar6;
                    }
                    else {
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                            puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                      }
                      else if (puVar9[local_b4 - lVar2] == '\0') {
                        uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                            puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                      }
                      else {
LAB_00179b36:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + -1) + lVar3] == '\0') {
                          uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(local_b4 + -2) * 4 + lVar4),
                                              *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4))
                          ;
                          puVar10[local_b4] = uVar7;
                        }
                        else {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        }
                      }
LAB_0017a37c:
                      iVar6 = local_b4 + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) {
                          if (puVar9[iVar6] == '\0') {
                            puVar10[iVar6] = 0;
                            return;
                          }
                          if (puVar9[local_b4 + 1] != '\0') {
                            puVar10[iVar6] = puVar10[local_b4];
                            return;
                          }
                        }
                        else {
                          if (puVar9[iVar6] == '\0') goto LAB_0017ab77;
                          if (puVar9[local_b4 + 1] != '\0') {
LAB_0017b079:
                            local_b4 = iVar6;
                            if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                              puVar10[local_b4] = puVar10[local_b4 + -2];
                              return;
                            }
                            if (puVar9[local_b4 - lVar2] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            if (puVar9[local_b4 + lVar3] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4
                                                         ),puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                            return;
                          }
                          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                            local_b4 = iVar6;
                            if (puVar9[iVar6 - lVar2] != '\0') {
                              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                              return;
                            }
LAB_0017ac48:
                            if (puVar9[local_b4 + lVar3] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                         (long)(local_b4 + -2) * 4 + lVar4),
                                                *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4
                                                         ));
                            puVar10[local_b4] = uVar7;
                            return;
                          }
                        }
                        if (puVar9[iVar6 - lVar2] != '\0') {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                          return;
                        }
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        return;
                      }
                      if (puVar9[iVar6] == '\0') goto LAB_00179362;
                      if (puVar9[local_b4 + 1] != '\0') {
LAB_0017a0c7:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                          if (puVar9[local_b4 + 1] == '\0') {
                            puVar10[local_b4] = puVar10[local_b4 + -2];
                            goto LAB_00179102;
                          }
                          if (puVar9[(local_b4 + 2) - lVar2] == '\0') {
                            puVar10[local_b4] = puVar10[local_b4 + -2];
                            goto LAB_0017a580;
                          }
                          if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                         (long)(local_b4 + 2) * 4 + lVar4),
                                                puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                          }
                          else if (puVar9[local_b4 - lVar2] == '\0') {
                            if (puVar9[local_b4 + lVar3] == '\0') {
                              uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                           (long)(local_b4 + 2) * 4 + lVar4),
                                                  puVar10[local_b4 + -2]);
                              puVar10[local_b4] = uVar7;
                            }
                            else {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                            }
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                          }
                          goto LAB_00179dfb;
                        }
                        if (puVar9[local_b4 - lVar2] == '\0') {
                          if (puVar9[local_b4 + lVar3] == '\0') {
                            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4
                                                         ),puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                        }
                        else {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        }
                        goto LAB_0017a37c;
                      }
                      if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                        local_b4 = iVar6;
                        if (puVar9[iVar6 - lVar2] == '\0') {
LAB_001794a9:
                          if (puVar9[local_b4 + lVar3] == '\0') {
                            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                         (long)(local_b4 + -2) * 4 + lVar4),
                                                *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4
                                                         ));
                            puVar10[local_b4] = uVar7;
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                        }
                        else {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                        }
                        goto LAB_0017a37c;
                      }
                      if (puVar9[local_b4 + 3] == '\0') {
                        if (puVar9[iVar6 - lVar2] == '\0') {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          local_b4 = iVar6;
                        }
                        else {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                          local_b4 = iVar6;
                        }
                        goto LAB_00179102;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001791f2;
LAB_001795d0:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                          uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(local_b4 + -2) * 4 + lVar4),
                                              *(uint *)((long)puVar10 +
                                                       (long)(local_b4 + 2) * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else if (puVar9[local_b4 + lVar3] == '\0') {
                          uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                       (long)(local_b4 + -2) * 4 + lVar4),
                                              *(uint *)((long)puVar10 +
                                                       (long)(local_b4 + 2) * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else {
                          puVar10[local_b4] =
                               *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                        }
                        goto LAB_00179dfb;
                      }
                      if (puVar9[iVar6 - lVar2] != '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                        local_b4 = iVar6;
                        goto LAB_00179aab;
                      }
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                      local_b4 = iVar6;
LAB_0017983c:
                      iVar6 = local_b4 + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) goto LAB_0017a9d9;
                        if (puVar9[iVar6] != '\0') {
                          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                            uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                                puVar10[local_b4]);
                            puVar10[iVar6] = uVar7;
                            return;
                          }
                          puVar10[iVar6] = puVar10[local_b4];
                          return;
                        }
                        goto LAB_0017ada1;
                      }
                      if (puVar9[iVar6] == '\0') {
LAB_001799c9:
                        local_b4 = iVar6;
                        if (puVar9[local_b4 + 1] == '\0') {
                          puVar10[local_b4] = 0;
                          goto LAB_001793db;
                        }
                        if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
LAB_0017a077:
                          while (iVar6 = local_b4 + 2, iVar6 < (int)(uVar1 - 2)) {
                            if (puVar9[iVar6] != '\0') goto LAB_0017a0c7;
LAB_00179362:
                            while (local_b4 = iVar6, puVar9[local_b4 + 1] == '\0') {
                              puVar10[local_b4] = 0;
LAB_001793db:
                              iVar6 = local_b4 + 2;
                              if ((int)(uVar1 - 2) <= iVar6) {
                                if ((int)(uVar1 - 2) < iVar6) {
                                  if (puVar9[iVar6] == '\0') {
                                    puVar10[iVar6] = 0;
                                    return;
                                  }
                                }
                                else {
                                  if (puVar9[iVar6] == '\0') goto LAB_0017ab77;
                                  if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                                    if (puVar9[iVar6 - lVar2] != '\0') {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                      return;
                                    }
                                    iVar11 = local_b4 + 1;
                                    local_b4 = iVar6;
                                    if (puVar9[iVar11 - lVar2] == '\0') {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                      return;
                                    }
                                    goto LAB_0017ac48;
                                  }
                                }
                                if (puVar9[iVar6 - lVar2] != '\0') {
                                  puVar10[iVar6] =
                                       *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                  return;
                                }
                                if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                                  puVar10[iVar6] =
                                       *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                  return;
                                }
                                uVar7 = UFPC::NewLabel();
                                puVar10[iVar6] = uVar7;
                                return;
                              }
                              if (puVar9[iVar6] != '\0') {
                                if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                                  if (puVar9[iVar6 - lVar2] == '\0') {
                                    iVar11 = local_b4 + 1;
                                    local_b4 = iVar6;
                                    if (puVar9[iVar11 - lVar2] != '\0') goto LAB_001794a9;
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_0017a37c;
                                }
                                if (puVar9[local_b4 + 3] == '\0') {
                                  if (puVar9[iVar6 - lVar2] == '\0') {
                                    if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                                      uVar7 = UFPC::NewLabel();
                                      puVar10[iVar6] = uVar7;
                                      local_b4 = iVar6;
                                    }
                                    else {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                      local_b4 = iVar6;
                                    }
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_00179102;
                                }
                                if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                                  if (puVar9[iVar6 - lVar2] != '\0') {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                    goto LAB_00179aab;
                                  }
                                  if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                                    uVar7 = UFPC::NewLabel();
                                    puVar10[iVar6] = uVar7;
                                    local_b4 = iVar6;
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_0017983c;
                                }
                                if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001791f2;
                                if (puVar9[(local_b4 + 1) - lVar2] != '\0') goto LAB_001795d0;
                                puVar10[iVar6] =
                                     *(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4);
                                local_b4 = iVar6;
                                goto LAB_00179dfb;
                              }
                            }
                            if (puVar9[(local_b4 + 1) - lVar2] == '\0') goto LAB_001791b5;
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                          if ((int)(uVar1 - 2) < iVar6) goto LAB_0017a9d9;
                          if (puVar9[iVar6] == '\0') goto LAB_0017ab77;
                          goto LAB_0017b079;
                        }
                        if (puVar9[(local_b4 + 2) - lVar2] != '\0') {
                          puVar10[local_b4] =
                               *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                          goto LAB_00179dfb;
                        }
                        uVar7 = UFPC::NewLabel();
                        puVar10[local_b4] = uVar7;
                        goto LAB_0017983c;
                      }
                      if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                        uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                            puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                        goto LAB_0017a37c;
                      }
                      if (puVar9[local_b4 + 3] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        local_b4 = iVar6;
                        goto LAB_00179102;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        uVar7 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                     (long)(local_b4 + 4) * 4 + lVar4),
                                            puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                        goto LAB_00179dfb;
                      }
                      puVar10[iVar6] = puVar10[local_b4];
                      local_b4 = iVar6;
                    }
                  } while( true );
                }
                if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
                  uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                      puVar10[local_b4]);
                  puVar10[iVar6] = uVar7;
                  local_b4 = iVar6;
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4);
                  local_b4 = iVar6;
                }
                goto LAB_00179dfb;
              }
              if (puVar9[local_b4 + 3] == '\0') {
                puVar10[iVar6] = 0;
                local_b4 = iVar6;
                goto LAB_001793db;
              }
              if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                local_b4 = iVar6;
                goto LAB_0017a077;
              }
              if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                local_b4 = iVar6;
                goto LAB_00179aab;
              }
LAB_001791f2:
              local_b4 = iVar6;
              if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                uVar7 = UFPC::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4),
                                    *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4));
                puVar10[local_b4] = uVar7;
              }
              else {
                puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
              }
            } while( true );
          }
          puVar10[iVar6] = puVar10[local_b4];
          local_b4 = iVar6;
        }
        goto LAB_00179102;
      }
      if ((int)(uVar1 - 2) < iVar6) {
        local_b4 = iVar6;
        if (puVar9[iVar6] == '\0') {
          puVar10[iVar6] = 0;
          return;
        }
      }
      else {
        local_b4 = iVar6;
        if (puVar9[iVar6] == '\0') {
LAB_0017ab77:
          local_b4 = iVar6;
          if (puVar9[local_b4 + 1] == '\0') {
            puVar10[local_b4] = 0;
            return;
          }
        }
        if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
          return;
        }
      }
      if (puVar9[local_b4 - lVar2] == '\0') {
        uVar7 = UFPC::NewLabel();
        puVar10[local_b4] = uVar7;
      }
      else {
        puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
      }
    }
  }
  return;
LAB_00176a55:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
LAB_00176a71:
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                            puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
      }
    }
    else {
      puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
    }
    goto LAB_0017769e;
  }
  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
    puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
    goto LAB_001779ac;
  }
LAB_00176b17:
  iVar6 = img_row_3._4_4_;
  if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') goto LAB_00176b33;
  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
  goto LAB_00176e59;
LAB_00176530:
  if (puVar9[img_row_3._4_4_ + 3] == '\0') {
    puVar10[iVar6] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar6;
LAB_001779ac:
    iVar6 = img_row_3._4_4_ + 2;
    if ((int)(uVar1 - 2) <= iVar6) {
      if ((int)(uVar1 - 2) < iVar6) {
        if (puVar9[iVar6] == '\0') goto LAB_00177ffb;
        if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00177d82;
      }
      else {
        if (puVar9[iVar6] == '\0') {
          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178423;
          if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_0017800e;
        }
        if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001783aa;
        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
          if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                puVar10[img_row_3._4_4_]);
            puVar10[iVar6] = uVar8;
          }
          else {
LAB_00178d44:
            img_row_3._4_4_ = iVar6;
            iVar6 = img_row_3._4_4_;
            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_00178a89;
            uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                puVar10[img_row_3._4_4_ + -2]);
            puVar10[img_row_3._4_4_] = uVar8;
          }
          goto LAB_00179028;
        }
      }
      if (puVar9[iVar6 - lVar2] != '\0') goto LAB_0017831f;
      puVar10[iVar6] = puVar10[img_row_3._4_4_];
      goto LAB_00179028;
    }
    if (puVar9[iVar6] == '\0') {
      if (puVar9[iVar6 + lVar3] == '\0') goto LAB_0017578b;
      if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_00176e07;
      if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_0017573c;
      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                              puVar10[img_row_3._4_4_]);
          puVar10[iVar6] = uVar8;
          img_row_3._4_4_ = iVar6;
        }
        else {
LAB_0017763d:
          img_row_3._4_4_ = iVar6;
          iVar6 = img_row_3._4_4_;
          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_00176cac;
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                              puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        goto LAB_00176a14;
      }
    }
    else {
      if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00175589;
      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                              puVar10[img_row_3._4_4_]);
          puVar10[iVar6] = uVar8;
          img_row_3._4_4_ = iVar6;
        }
        else {
LAB_001772de:
          img_row_3._4_4_ = iVar6;
          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_00176a71;
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                              puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        goto LAB_0017769e;
      }
      if (puVar9[img_row_3._4_4_ + 3] == '\0') {
        if (puVar9[iVar6 - lVar2] == '\0') {
          puVar10[iVar6] = puVar10[img_row_3._4_4_];
          img_row_3._4_4_ = iVar6;
          goto LAB_001771a6;
        }
        if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00177558;
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                            puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
LAB_0017726d:
        while (iVar6 = img_row_3._4_4_ + 2, iVar6 < (int)(uVar1 - 2)) {
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] != '\0') {
              if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_00176e07;
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_0017573c;
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') goto LAB_00177347;
              goto LAB_0017763d;
            }
LAB_0017578b:
            while( true ) {
              while( true ) {
                img_row_3._4_4_ = iVar6;
                iVar6 = img_row_3._4_4_;
                if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_0017573c;
LAB_001757a5:
                img_row_3._4_4_ = iVar6;
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') break;
                uVar8 = UFPC::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                iVar6 = img_row_3._4_4_ + 2;
                if ((int)(uVar1 - 2) <= iVar6) {
                  if ((int)(uVar1 - 2) < iVar6) {
                    img_row_3._4_4_ = iVar6;
                    if (puVar9[iVar6] == '\0') goto LAB_00177f4f;
                    goto LAB_00177ea2;
                  }
                  if (puVar9[iVar6] != '\0') goto LAB_00178593;
                  if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178423;
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_001786f8;
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  goto LAB_00179028;
                }
                if (puVar9[iVar6] != '\0') goto LAB_00175b6c;
                if (puVar9[iVar6 + lVar3] != '\0') {
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_00176064;
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar6;
                  goto LAB_00176d5d;
                }
              }
              puVar10[img_row_3._4_4_] = 0;
              img_row_3._4_4_ = img_row_3._4_4_ + 2;
              if ((int)(uVar1 - 2) <= img_row_3._4_4_) {
                if ((int)(uVar1 - 2) < img_row_3._4_4_) {
                  if (puVar9[img_row_3._4_4_] == '\0') goto LAB_00177dc1;
                  goto LAB_00177e0f;
                }
                if (puVar9[img_row_3._4_4_] == '\0') goto LAB_001783e4;
                goto LAB_0017849b;
              }
              if (puVar9[img_row_3._4_4_] != '\0') break;
LAB_00175713:
              iVar6 = img_row_3._4_4_;
              if (puVar9[img_row_3._4_4_ + lVar3] != '\0') {
                if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_0017573c;
                uVar8 = UFPC::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                goto LAB_00176d5d;
              }
            }
LAB_00175822:
            if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
              if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0') goto LAB_00175880;
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
              goto LAB_0017769e;
            }
            if (puVar9[img_row_3._4_4_ + 1] != '\0') {
              if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
                if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00175603;
                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                }
                else {
LAB_0017595f:
                  if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                 (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                        *(uint *)((long)puVar10 +
                                                 (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 +
                                                 (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                        *(uint *)((long)puVar10 +
                                                 (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                  }
                }
                goto LAB_001767c9;
              }
              if (puVar9[img_row_3._4_4_ - lVar2] != '\0') {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                goto LAB_0017642f;
              }
              if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                uVar8 = UFPC::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
              }
              goto LAB_001761d0;
            }
            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
              if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                uVar8 = UFPC::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
              }
              goto LAB_001771a6;
            }
            puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
          }
          else {
            if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00175589;
            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_001772de;
            if (puVar9[img_row_3._4_4_ + 3] != '\0') {
LAB_00177347:
              if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
                if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001774c2;
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_001761d0;
              }
              if (puVar9[(img_row_3._4_4_ + 3) + lVar4] != '\0') goto LAB_00177379;
              if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001773e2;
              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5)
                                  ,puVar10[img_row_3._4_4_]);
              puVar10[iVar6] = uVar8;
              img_row_3._4_4_ = iVar6;
              goto LAB_001767c9;
            }
            if (puVar9[iVar6 - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
LAB_001771a6:
              while( true ) {
                iVar6 = img_row_3._4_4_ + 2;
                if ((int)(uVar1 - 2) <= iVar6) {
                  if (iVar6 <= (int)(uVar1 - 2)) {
                    img_row_3._4_4_ = iVar6;
                    if (puVar9[iVar6] == '\0') goto LAB_00178bb1;
                    goto LAB_00178bda;
                  }
                  if (puVar9[iVar6] == '\0') goto LAB_00177ffb;
                  iVar11 = img_row_3._4_4_ + 1;
                  img_row_3._4_4_ = iVar6;
                  if (puVar9[iVar11 + lVar3] == '\0') goto LAB_00177d82;
                  goto LAB_00177eee;
                }
                if (puVar9[iVar6] == '\0') goto LAB_00176dba;
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00175589;
                if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                      puVar10[img_row_3._4_4_]);
                  puVar10[iVar6] = uVar8;
                  img_row_3._4_4_ = iVar6;
                  goto LAB_0017769e;
                }
                iVar11 = img_row_3._4_4_ + 3;
                img_row_3._4_4_ = iVar6;
                if (puVar9[iVar11] != '\0') goto LAB_001760ae;
LAB_00175fd0:
                if (puVar9[img_row_3._4_4_ - lVar2] != '\0') break;
                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
              }
              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                  puVar10[img_row_3._4_4_ + -2]);
              puVar10[img_row_3._4_4_] = uVar8;
            }
            else {
LAB_00177558:
              img_row_3._4_4_ = iVar6;
              if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                    puVar10[img_row_3._4_4_ + -2]);
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
            }
          }
        }
        if ((int)(uVar1 - 2) < iVar6) {
          if (puVar9[iVar6] == '\0') goto LAB_00177ffb;
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00177d82;
        }
        else {
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00178423;
            if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_0017800e;
          }
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001783aa;
          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_00178d44;
        }
        if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001780e5;
        puVar10[iVar6] = puVar10[img_row_3._4_4_];
        goto LAB_00179028;
      }
    }
    if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
      if (puVar9[iVar6 - lVar2] == '\0') {
        puVar10[iVar6] = puVar10[img_row_3._4_4_];
        img_row_3._4_4_ = iVar6;
        goto LAB_001761d0;
      }
      if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                            puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else {
LAB_001774c2:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                              puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
        }
      }
      goto LAB_0017642f;
    }
    if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
      if (puVar9[iVar6 - lVar2] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                            puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                            *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5));
        uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else {
LAB_001773e2:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                              *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
          uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                              puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
      }
    }
    else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                          puVar10[img_row_3._4_4_]);
      puVar10[iVar6] = uVar8;
      img_row_3._4_4_ = iVar6;
    }
    else {
LAB_00177379:
      img_row_3._4_4_ = iVar6;
      if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_00176b4f;
      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                          puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001767c9;
  }
LAB_0017654c:
  if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
    puVar10[iVar6] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar6;
    goto LAB_00176e59;
  }
  if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                        puVar10[img_row_3._4_4_]);
    puVar10[iVar6] = uVar8;
    img_row_3._4_4_ = iVar6;
  }
  else {
    if (puVar9[iVar6 + lVar4] != '\0') goto LAB_00176593;
    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                        puVar10[img_row_3._4_4_]);
    puVar10[iVar6] = uVar8;
    img_row_3._4_4_ = iVar6;
  }
  goto LAB_001767c9;
LAB_0017573c:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
    puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
    goto LAB_00176a14;
  }
LAB_001755d6:
  if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
    if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00175603;
    puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
    goto LAB_001767c9;
  }
  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
    uVar8 = UFPC::NewLabel();
    puVar10[img_row_3._4_4_] = uVar8;
    goto LAB_001761d0;
  }
  puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
  goto LAB_0017642f;
LAB_00175b6c:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                            puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                            *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5));
        uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                            puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
    }
    else {
      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                          puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_0017769e;
  }
  if (puVar9[img_row_3._4_4_ + 1] != '\0') {
    if (puVar9[(img_row_3._4_4_ + 2) - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') goto LAB_00175f1e;
      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                          puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
      goto LAB_00176e59;
    }
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                            puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                            *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
        uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                            *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
        uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                            puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
    }
    else if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                          *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
      uVar8 = UFPC::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    else {
      uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                          puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001767c9;
  }
  if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') goto LAB_00175fd0;
  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                      puVar10[img_row_3._4_4_ + -2]);
  puVar10[img_row_3._4_4_] = uVar8;
  goto LAB_001779ac;
LAB_00176b33:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
    uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                        puVar10[img_row_3._4_4_ + -2]);
    puVar10[img_row_3._4_4_] = uVar8;
  }
  else {
LAB_00176b4f:
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                            puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        puVar10[img_row_3._4_4_] =
             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
      }
    }
    else {
      puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
    }
  }
  goto LAB_001767c9;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}